

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O1

Mat * ncnn::Mat::from_pixels
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                Allocator *allocator)

{
  byte bVar1;
  ulong uVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  ulong uVar8;
  void *pvVar9;
  float *pfVar10;
  long lVar11;
  float *pfVar12;
  void *pvVar13;
  ulong uVar14;
  long lVar15;
  float *pfVar16;
  float *pfVar17;
  void *pvVar18;
  int iVar19;
  void *pvVar20;
  byte *pbVar21;
  int iVar22;
  int iVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar30;
  undefined1 auVar29 [16];
  Mat m;
  Mat local_78;
  
  __return_storage_ptr__->cstep = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->d = 0;
  __return_storage_ptr__->c = 0;
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      from_rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
    }
    if (type == 3) {
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar10 = (float *)__return_storage_ptr__->data;
      if ((pfVar10 != (float *)0x0) &&
         ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
        iVar30 = 1;
        iVar25 = h;
        if (stride - w == 0) {
          iVar30 = h;
          iVar25 = 1;
        }
        if (0 < iVar25) {
          iVar19 = 0;
          pbVar21 = pixels;
          do {
            iVar22 = iVar30 * w + 1;
            if (0 < iVar30 * w) {
              do {
                *pfVar10 = (float)*pbVar21;
                pbVar21 = pbVar21 + 1;
                pfVar10 = pfVar10 + 1;
                iVar22 = iVar22 + -1;
              } while (1 < iVar22);
            }
            pbVar21 = pbVar21 + (stride - w);
            iVar19 = iVar19 + 1;
          } while (iVar19 != iVar25);
        }
      }
    }
    if ((type & 0xfffeU) != 4) {
      return __return_storage_ptr__;
    }
    create(__return_storage_ptr__,w,h,4,4,allocator);
    pfVar10 = (float *)__return_storage_ptr__->data;
    if (pfVar10 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar25 = stride + w * -4;
    iVar30 = 1;
    if (iVar25 == 0) {
      iVar30 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    lVar11 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
    pfVar16 = (float *)(lVar11 * 3 + (long)pfVar10);
    pfVar17 = (float *)((long)pfVar10 + lVar11 * 2);
    pfVar12 = (float *)(lVar11 + (long)pfVar10);
    iVar19 = 0;
    do {
      iVar22 = iVar30 * w + 1;
      if (0 < iVar30 * w) {
        do {
          *pfVar10 = (float)*pixels;
          *pfVar12 = (float)pixels[1];
          *pfVar17 = (float)pixels[2];
          *pfVar16 = (float)pixels[3];
          pixels = pixels + 4;
          pfVar10 = pfVar10 + 1;
          pfVar12 = pfVar12 + 1;
          pfVar17 = pfVar17 + 1;
          pfVar16 = pfVar16 + 1;
          iVar22 = iVar22 + -1;
        } while (1 < iVar22);
      }
      pixels = pixels + iVar25;
      iVar19 = iVar19 + 1;
    } while (iVar19 != h);
    return __return_storage_ptr__;
  }
  if (type < 0x30001) {
    switch(type) {
    case 0x10002:
switchD_001a9093_caseD_20001:
      from_rgb2bgr(pixels,w,h,stride,__return_storage_ptr__,allocator);
      return __return_storage_ptr__;
    case 0x10003:
switchD_001a9093_caseD_20003:
      from_gray2rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
      return __return_storage_ptr__;
    case 0x10004:
switchD_001a9093_caseD_20005:
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar10 = (float *)__return_storage_ptr__->data;
      if (pfVar10 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar25 = stride + w * -4;
      iVar30 = 1;
      if (iVar25 == 0) {
        iVar30 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar11 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pfVar17 = (float *)((long)pfVar10 + lVar11 * 2);
      pfVar12 = (float *)(lVar11 + (long)pfVar10);
      iVar19 = 0;
      do {
        iVar22 = iVar30 * w + 1;
        if (0 < iVar30 * w) {
          do {
            *pfVar10 = (float)*pixels;
            *pfVar12 = (float)pixels[1];
            *pfVar17 = (float)pixels[2];
            pixels = pixels + 4;
            pfVar10 = pfVar10 + 1;
            pfVar12 = pfVar12 + 1;
            pfVar17 = pfVar17 + 1;
            iVar22 = iVar22 + -1;
          } while (1 < iVar22);
        }
        pixels = pixels + iVar25;
        iVar19 = iVar19 + 1;
      } while (iVar19 != h);
      return __return_storage_ptr__;
    case 0x10005:
switchD_001a9093_caseD_20004:
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar10 = (float *)__return_storage_ptr__->data;
      if (pfVar10 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar25 = stride + w * -4;
      iVar30 = 1;
      if (iVar25 == 0) {
        iVar30 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar11 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pfVar17 = (float *)((long)pfVar10 + lVar11 * 2);
      pfVar12 = (float *)(lVar11 + (long)pfVar10);
      iVar19 = 0;
      do {
        iVar22 = iVar30 * w + 1;
        if (0 < iVar30 * w) {
          do {
            *pfVar10 = (float)pixels[2];
            *pfVar12 = (float)pixels[1];
            *pfVar17 = (float)*pixels;
            pixels = pixels + 4;
            pfVar10 = pfVar10 + 1;
            pfVar12 = pfVar12 + 1;
            pfVar17 = pfVar17 + 1;
            iVar22 = iVar22 + -1;
          } while (1 < iVar22);
        }
        pixels = pixels + iVar25;
        iVar19 = iVar19 + 1;
      } while (iVar19 != h);
      return __return_storage_ptr__;
    default:
      switch(type) {
      case 0x20001:
        goto switchD_001a9093_caseD_20001;
      default:
        goto switchD_001a9063_default;
      case 0x20003:
        goto switchD_001a9093_caseD_20003;
      case 0x20004:
        goto switchD_001a9093_caseD_20004;
      case 0x20005:
        goto switchD_001a9093_caseD_20005;
      }
    }
  }
  switch(type) {
  case 0x30001:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar10 = (float *)__return_storage_ptr__->data;
    if ((pfVar10 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar25 = stride + w * -3;
      iVar30 = 1;
      if (iVar25 == 0) {
        iVar30 = h;
        h = 1;
      }
      if (0 < h) {
        iVar19 = 0;
        do {
          iVar22 = iVar30 * w + 1;
          if (0 < iVar30 * w) {
            do {
              bVar1 = pixels[2];
              *pfVar10 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                                 (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d >> 8);
              pixels = pixels + 3;
              pfVar10 = pfVar10 + 1;
              iVar22 = iVar22 + -1;
            } while (1 < iVar22);
          }
          pixels = pixels + iVar25;
          iVar19 = iVar19 + 1;
        } while (iVar19 != h);
      }
    }
    break;
  case 0x30002:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar10 = (float *)__return_storage_ptr__->data;
    if ((pfVar10 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar25 = stride + w * -3;
      iVar30 = 1;
      if (iVar25 == 0) {
        iVar30 = h;
        h = 1;
      }
      if (0 < h) {
        iVar19 = 0;
        do {
          iVar22 = iVar30 * w + 1;
          if (0 < iVar30 * w) {
            do {
              bVar1 = *pixels;
              *pfVar10 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                                 (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d >> 8);
              pixels = pixels + 3;
              pfVar10 = pfVar10 + 1;
              iVar22 = iVar22 + -1;
            } while (1 < iVar22);
          }
          pixels = pixels + iVar25;
          iVar19 = iVar19 + 1;
        } while (iVar19 != h);
      }
    }
    break;
  case 0x30003:
switchD_001a9063_default:
    from_pixels((Mat *)(ulong)(uint)type);
    return __return_storage_ptr__;
  case 0x30004:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar10 = (float *)__return_storage_ptr__->data;
    if ((pfVar10 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar25 = stride + w * -4;
      iVar30 = 1;
      if (iVar25 == 0) {
        iVar30 = h;
        h = 1;
      }
      if (0 < h) {
        iVar19 = 0;
        do {
          iVar22 = iVar30 * w + 1;
          if (0 < iVar30 * w) {
            do {
              bVar1 = pixels[2];
              *pfVar10 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                                 (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d >> 8);
              pixels = pixels + 4;
              pfVar10 = pfVar10 + 1;
              iVar22 = iVar22 + -1;
            } while (1 < iVar22);
          }
          pixels = pixels + iVar25;
          iVar19 = iVar19 + 1;
        } while (iVar19 != h);
      }
    }
    break;
  case 0x30005:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar10 = (float *)__return_storage_ptr__->data;
    if ((pfVar10 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar25 = stride + w * -4;
      iVar30 = 1;
      if (iVar25 == 0) {
        iVar30 = h;
        h = 1;
      }
      if (0 < h) {
        iVar19 = 0;
        do {
          iVar22 = iVar30 * w + 1;
          if (0 < iVar30 * w) {
            do {
              bVar1 = *pixels;
              *pfVar10 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                                 (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d >> 8);
              pixels = pixels + 4;
              pfVar10 = pfVar10 + 1;
              iVar22 = iVar22 + -1;
            } while (1 < iVar22);
          }
          pixels = pixels + iVar25;
          iVar19 = iVar19 + 1;
        } while (iVar19 != h);
      }
    }
    break;
  default:
    switch(type) {
    case 0x40001:
switchD_001a9063_caseD_50002:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      local_78.data = __return_storage_ptr__->data;
      if (local_78.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      local_78.h = __return_storage_ptr__->h;
      local_78.d = __return_storage_ptr__->d;
      local_78.cstep = __return_storage_ptr__->elemsize;
      local_78.elempack = __return_storage_ptr__->elempack;
      local_78.allocator = __return_storage_ptr__->allocator;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = (undefined4)local_78.cstep;
      local_78.elemsize._4_4_ = (undefined4)(local_78.cstep >> 0x20);
      local_78.c = 3;
      local_78.cstep =
           ((long)__return_storage_ptr__->d * local_78.cstep *
            (long)__return_storage_ptr__->h * (long)__return_storage_ptr__->w + 0xf &
           0xfffffffffffffff0) / local_78.cstep;
      local_78.dims = __return_storage_ptr__->dims;
      local_78.w = __return_storage_ptr__->w;
      from_rgb(pixels,w,h,stride,&local_78,allocator);
      auVar6 = _DAT_005aa0b0;
      auVar5 = _DAT_005aa0a0;
      auVar4 = _DAT_005aa090;
      lVar11 = (long)__return_storage_ptr__->h * (long)__return_storage_ptr__->w;
      uVar2 = __return_storage_ptr__->elemsize;
      uVar8 = uVar2 * lVar11 + 0xf & 0xfffffffffffffff0;
      uVar14 = uVar8 % uVar2;
      iVar25 = (int)(uVar8 / uVar2);
      if (__return_storage_ptr__->dims == 4) {
        iVar25 = (int)lVar11;
      }
      uVar7 = iVar25 * __return_storage_ptr__->d;
      if (0 < (int)uVar7) {
        pvVar9 = __return_storage_ptr__->data;
        lVar11 = uVar2 * __return_storage_ptr__->cstep;
        lVar15 = (ulong)uVar7 - 1;
        auVar23._8_4_ = (int)lVar15;
        auVar23._0_8_ = lVar15;
        auVar23._12_4_ = (int)((ulong)lVar15 >> 0x20);
        uVar14 = 0;
        auVar23 = auVar23 ^ _DAT_005aa0b0;
        do {
          auVar26._8_4_ = (int)uVar14;
          auVar26._0_8_ = uVar14;
          auVar26._12_4_ = (int)(uVar14 >> 0x20);
          auVar24 = (auVar26 | auVar5) ^ auVar6;
          iVar25 = auVar23._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar25 && auVar23._0_4_ < auVar24._0_4_ ||
                      iVar25 < auVar24._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar9 + uVar14 * 4 + lVar11 * 3) = 0x437f0000;
          }
          if ((auVar24._12_4_ != auVar23._12_4_ || auVar24._8_4_ <= auVar23._8_4_) &&
              auVar24._12_4_ <= auVar23._12_4_) {
            *(undefined4 *)((long)pvVar9 + uVar14 * 4 + lVar11 * 3 + 4) = 0x437f0000;
          }
          auVar24 = (auVar26 | auVar4) ^ auVar6;
          iVar30 = auVar24._4_4_;
          if (iVar30 <= iVar25 && (iVar30 != iVar25 || auVar24._0_4_ <= auVar23._0_4_)) {
            *(undefined4 *)((long)pvVar9 + uVar14 * 4 + lVar11 * 3 + 8) = 0x437f0000;
            *(undefined4 *)((long)pvVar9 + uVar14 * 4 + lVar11 * 3 + 0xc) = 0x437f0000;
          }
          uVar14 = uVar14 + 4;
        } while ((uVar7 + 3 & 0xfffffffc) != uVar14);
      }
      piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar3 == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 != 0) {
        return __return_storage_ptr__;
      }
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])(local_78.allocator,local_78.data,uVar14);
        return __return_storage_ptr__;
      }
      break;
    case 0x40002:
switchD_001a9063_caseD_50001:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      local_78.data = __return_storage_ptr__->data;
      if (local_78.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      local_78.h = __return_storage_ptr__->h;
      local_78.d = __return_storage_ptr__->d;
      local_78.cstep = __return_storage_ptr__->elemsize;
      local_78.elempack = __return_storage_ptr__->elempack;
      local_78.allocator = __return_storage_ptr__->allocator;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = (undefined4)local_78.cstep;
      local_78.elemsize._4_4_ = (undefined4)(local_78.cstep >> 0x20);
      local_78.c = 3;
      local_78.cstep =
           ((long)__return_storage_ptr__->d * local_78.cstep *
            (long)__return_storage_ptr__->h * (long)__return_storage_ptr__->w + 0xf &
           0xfffffffffffffff0) / local_78.cstep;
      local_78.dims = __return_storage_ptr__->dims;
      local_78.w = __return_storage_ptr__->w;
      from_rgb2bgr(pixels,w,h,stride,&local_78,allocator);
      auVar6 = _DAT_005aa0b0;
      auVar5 = _DAT_005aa0a0;
      auVar4 = _DAT_005aa090;
      lVar11 = (long)__return_storage_ptr__->h * (long)__return_storage_ptr__->w;
      uVar2 = __return_storage_ptr__->elemsize;
      uVar8 = uVar2 * lVar11 + 0xf & 0xfffffffffffffff0;
      uVar14 = uVar8 % uVar2;
      iVar25 = (int)(uVar8 / uVar2);
      if (__return_storage_ptr__->dims == 4) {
        iVar25 = (int)lVar11;
      }
      uVar7 = iVar25 * __return_storage_ptr__->d;
      if (0 < (int)uVar7) {
        pvVar9 = __return_storage_ptr__->data;
        lVar11 = uVar2 * __return_storage_ptr__->cstep;
        lVar15 = (ulong)uVar7 - 1;
        auVar29._8_4_ = (int)lVar15;
        auVar29._0_8_ = lVar15;
        auVar29._12_4_ = (int)((ulong)lVar15 >> 0x20);
        uVar14 = 0;
        auVar29 = auVar29 ^ _DAT_005aa0b0;
        do {
          auVar28._8_4_ = (int)uVar14;
          auVar28._0_8_ = uVar14;
          auVar28._12_4_ = (int)(uVar14 >> 0x20);
          auVar24 = (auVar28 | auVar5) ^ auVar6;
          iVar25 = auVar29._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar25 && auVar29._0_4_ < auVar24._0_4_ ||
                      iVar25 < auVar24._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar9 + uVar14 * 4 + lVar11 * 3) = 0x437f0000;
          }
          if ((auVar24._12_4_ != auVar29._12_4_ || auVar24._8_4_ <= auVar29._8_4_) &&
              auVar24._12_4_ <= auVar29._12_4_) {
            *(undefined4 *)((long)pvVar9 + uVar14 * 4 + lVar11 * 3 + 4) = 0x437f0000;
          }
          auVar24 = (auVar28 | auVar4) ^ auVar6;
          iVar30 = auVar24._4_4_;
          if (iVar30 <= iVar25 && (iVar30 != iVar25 || auVar24._0_4_ <= auVar29._0_4_)) {
            *(undefined4 *)((long)pvVar9 + uVar14 * 4 + lVar11 * 3 + 8) = 0x437f0000;
            *(undefined4 *)((long)pvVar9 + uVar14 * 4 + lVar11 * 3 + 0xc) = 0x437f0000;
          }
          uVar14 = uVar14 + 4;
        } while ((uVar7 + 3 & 0xfffffffc) != uVar14);
      }
      piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar3 == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 != 0) {
        return __return_storage_ptr__;
      }
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])(local_78.allocator,local_78.data,uVar14);
        return __return_storage_ptr__;
      }
      break;
    case 0x40003:
switchD_001a9063_caseD_50003:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      local_78.data = __return_storage_ptr__->data;
      if (local_78.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      local_78.h = __return_storage_ptr__->h;
      local_78.d = __return_storage_ptr__->d;
      local_78.cstep = __return_storage_ptr__->elemsize;
      local_78.elempack = __return_storage_ptr__->elempack;
      local_78.allocator = __return_storage_ptr__->allocator;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = (undefined4)local_78.cstep;
      local_78.elemsize._4_4_ = (undefined4)(local_78.cstep >> 0x20);
      local_78.c = 3;
      local_78.cstep =
           ((long)__return_storage_ptr__->d * local_78.cstep *
            (long)__return_storage_ptr__->h * (long)__return_storage_ptr__->w + 0xf &
           0xfffffffffffffff0) / local_78.cstep;
      local_78.dims = __return_storage_ptr__->dims;
      local_78.w = __return_storage_ptr__->w;
      from_gray2rgb(pixels,w,h,stride,&local_78,allocator);
      auVar6 = _DAT_005aa0b0;
      auVar5 = _DAT_005aa0a0;
      auVar4 = _DAT_005aa090;
      lVar11 = (long)__return_storage_ptr__->h * (long)__return_storage_ptr__->w;
      uVar2 = __return_storage_ptr__->elemsize;
      uVar8 = uVar2 * lVar11 + 0xf & 0xfffffffffffffff0;
      uVar14 = uVar8 % uVar2;
      iVar25 = (int)(uVar8 / uVar2);
      if (__return_storage_ptr__->dims == 4) {
        iVar25 = (int)lVar11;
      }
      uVar7 = iVar25 * __return_storage_ptr__->d;
      if (0 < (int)uVar7) {
        pvVar9 = __return_storage_ptr__->data;
        lVar11 = uVar2 * __return_storage_ptr__->cstep;
        lVar15 = (ulong)uVar7 - 1;
        auVar24._8_4_ = (int)lVar15;
        auVar24._0_8_ = lVar15;
        auVar24._12_4_ = (int)((ulong)lVar15 >> 0x20);
        uVar14 = 0;
        auVar24 = auVar24 ^ _DAT_005aa0b0;
        do {
          auVar27._8_4_ = (int)uVar14;
          auVar27._0_8_ = uVar14;
          auVar27._12_4_ = (int)(uVar14 >> 0x20);
          auVar29 = (auVar27 | auVar5) ^ auVar6;
          iVar25 = auVar24._4_4_;
          if ((bool)(~(auVar29._4_4_ == iVar25 && auVar24._0_4_ < auVar29._0_4_ ||
                      iVar25 < auVar29._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar9 + uVar14 * 4 + lVar11 * 3) = 0x437f0000;
          }
          if ((auVar29._12_4_ != auVar24._12_4_ || auVar29._8_4_ <= auVar24._8_4_) &&
              auVar29._12_4_ <= auVar24._12_4_) {
            *(undefined4 *)((long)pvVar9 + uVar14 * 4 + lVar11 * 3 + 4) = 0x437f0000;
          }
          auVar27 = (auVar27 | auVar4) ^ auVar6;
          iVar30 = auVar27._4_4_;
          if (iVar30 <= iVar25 && (iVar30 != iVar25 || auVar27._0_4_ <= auVar24._0_4_)) {
            *(undefined4 *)((long)pvVar9 + uVar14 * 4 + lVar11 * 3 + 8) = 0x437f0000;
            *(undefined4 *)((long)pvVar9 + uVar14 * 4 + lVar11 * 3 + 0xc) = 0x437f0000;
          }
          uVar14 = uVar14 + 4;
        } while ((uVar7 + 3 & 0xfffffffc) != uVar14);
      }
      piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar3 == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 != 0) {
        return __return_storage_ptr__;
      }
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])(local_78.allocator,local_78.data,uVar14);
        return __return_storage_ptr__;
      }
      break;
    case 0x40004:
      goto switchD_001a9063_default;
    case 0x40005:
switchD_001a9063_caseD_50004:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      pvVar9 = __return_storage_ptr__->data;
      if (pvVar9 == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar25 = stride + w * -4;
      iVar30 = 1;
      if (iVar25 == 0) {
        iVar30 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar11 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pvVar18 = (void *)(lVar11 * 3 + (long)pvVar9);
      pvVar20 = (void *)((long)pvVar9 + lVar11 * 2);
      pvVar13 = (void *)(lVar11 + (long)pvVar9);
      iVar19 = 0;
      do {
        if (0 < iVar30 * w) {
          lVar11 = 0;
          iVar22 = iVar30 * w + 1;
          do {
            *(float *)((long)pvVar9 + lVar11) = (float)pixels[lVar11 + 2];
            *(float *)((long)pvVar13 + lVar11) = (float)pixels[lVar11 + 1];
            *(float *)((long)pvVar20 + lVar11) = (float)pixels[lVar11];
            *(float *)((long)pvVar18 + lVar11) = (float)pixels[lVar11 + 3];
            iVar22 = iVar22 + -1;
            lVar11 = lVar11 + 4;
          } while (1 < iVar22);
          pvVar18 = (void *)((long)pvVar18 + lVar11);
          pvVar20 = (void *)((long)pvVar20 + lVar11);
          pvVar13 = (void *)((long)pvVar13 + lVar11);
          pvVar9 = (void *)((long)pvVar9 + lVar11);
          pixels = pixels + lVar11;
        }
        pixels = pixels + iVar25;
        iVar19 = iVar19 + 1;
      } while (iVar19 != h);
      return __return_storage_ptr__;
    default:
      switch(type) {
      case 0x50001:
        goto switchD_001a9063_caseD_50001;
      case 0x50002:
        goto switchD_001a9063_caseD_50002;
      case 0x50003:
        goto switchD_001a9063_caseD_50003;
      case 0x50004:
        goto switchD_001a9063_caseD_50004;
      default:
        goto switchD_001a9063_default;
      }
    }
    if (local_78.data != (void *)0x0) {
      free(local_78.data);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, int stride, Allocator* allocator)
{
    Mat m;

    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            from_rgb2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2GRAY:
            from_rgb2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            from_rgb2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2GRAY:
            from_bgr2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            from_bgr2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGB:
        case PIXEL_GRAY2BGR:
            from_gray2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            from_gray2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2RGB:
        case PIXEL_BGRA2BGR:
            from_rgba2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGR:
        case PIXEL_BGRA2RGB:
            from_rgba2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2GRAY:
            from_rgba2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            from_rgba2bgra(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGRA2GRAY:
            from_bgra2gray(pixels, w, h, stride, m, allocator);
            break;
        default:
            // unimplemented convert type
            NCNN_LOGE("unimplemented convert type %d", type);
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            from_rgb(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_GRAY)
            from_gray(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            from_rgba(pixels, w, h, stride, m, allocator);
    }

    return m;
}